

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

bool __thiscall ast::Conditional_expression::evaluate(Conditional_expression *this)

{
  int iVar1;
  Expression *pEVar2;
  string local_40;
  
  iVar1 = (*this->logical_expression->_vptr_Expression[3])();
  if ((char)iVar1 != '\0') {
    pEVar2 = this->logical_expression;
    if (pEVar2->type == ABSOLUTE) {
      if ((short)pEVar2->value == 0) {
        iVar1 = (*this->false_expression->_vptr_Expression[3])();
        if ((char)iVar1 != '\0') {
          pEVar2 = this->false_expression;
          goto LAB_00120632;
        }
      }
      else {
        iVar1 = (*this->true_expression->_vptr_Expression[3])();
        if ((char)iVar1 != '\0') {
          pEVar2 = this->true_expression;
LAB_00120632:
          (this->super_Expression).type = pEVar2->type;
          (this->super_Expression).value = (uint)(ushort)pEVar2->value;
          return true;
        }
      }
    }
    else {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Most be an absolute expression","");
      error_report(&pEVar2->location,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  (this->super_Expression).type = INVALID;
  return false;
}

Assistant:

bool Conditional_expression::evaluate()
{
	if (!logical_expression->evaluate()) {
		type = INVALID;
		return false;
	}
	auto logical_type = logical_expression->get_type();
	if (logical_type != ABSOLUTE) {
		error_report(&logical_expression->location, "Most be an absolute expression");
		type = INVALID;
		return false;
	}
	if (logical_expression->get_value() != 0) {
		if (!true_expression->evaluate()) {
			type = INVALID;
			return false;
		}
		type = true_expression->get_type();
		value = true_expression->get_value();
		return true;
	}
	else {
		if (!false_expression->evaluate()) {
			type = INVALID;
			return false;
		}
		type = false_expression->get_type();
		value = false_expression->get_value();
		return true;
	}
}